

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::Square(Bignum *this)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  Vector<unsigned_int> *this_00;
  uint *puVar5;
  int iVar6;
  int i;
  int iVar7;
  int index;
  int index_00;
  int iVar8;
  ulong local_48;
  
  bVar3 = IsClamped(this);
  if (!bVar3) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x155,"void FIX::double_conversion::Bignum::Square()");
  }
  iVar1 = this->used_digits_;
  if (0x40 < iVar1) {
    abort();
  }
  this_00 = &this->bigits_;
  index_00 = iVar1;
  for (iVar7 = 0; iVar7 < index_00; iVar7 = iVar7 + 1) {
    puVar5 = Vector<unsigned_int>::operator[](this_00,iVar7);
    uVar2 = *puVar5;
    puVar5 = Vector<unsigned_int>::operator[](this_00,iVar1 + iVar7);
    *puVar5 = uVar2;
    index_00 = this->used_digits_;
  }
  local_48 = 0;
  for (iVar7 = 0; iVar6 = iVar1, iVar4 = iVar7, iVar7 < index_00; iVar7 = iVar7 + 1) {
    for (; iVar4 != -1; iVar4 = iVar4 + -1) {
      puVar5 = Vector<unsigned_int>::operator[](this_00,iVar1 + iVar4);
      uVar2 = *puVar5;
      puVar5 = Vector<unsigned_int>::operator[](this_00,iVar6);
      local_48 = local_48 + (ulong)*puVar5 * (ulong)uVar2;
      iVar6 = iVar6 + 1;
    }
    puVar5 = Vector<unsigned_int>::operator[](this_00,iVar7);
    *puVar5 = (uint)local_48 & 0xfffffff;
    local_48 = local_48 >> 0x1c;
    index_00 = this->used_digits_;
  }
  iVar7 = iVar1 + index_00;
  for (; iVar7 = iVar7 + 1, index_00 < iVar1 * 2; index_00 = index_00 + 1) {
    iVar4 = this->used_digits_;
    iVar8 = index_00 - iVar4;
    iVar6 = iVar1 + -1 + iVar4;
    index = iVar7 - iVar4;
    while (iVar8 = iVar8 + 1, iVar8 < iVar4) {
      puVar5 = Vector<unsigned_int>::operator[](this_00,iVar6);
      uVar2 = *puVar5;
      puVar5 = Vector<unsigned_int>::operator[](this_00,index);
      local_48 = local_48 + (ulong)*puVar5 * (ulong)uVar2;
      iVar6 = iVar6 + -1;
      index = index + 1;
      iVar4 = this->used_digits_;
    }
    puVar5 = Vector<unsigned_int>::operator[](this_00,index_00);
    *puVar5 = (uint)local_48 & 0xfffffff;
    local_48 = local_48 >> 0x1c;
  }
  if (local_48 != 0) {
    __assert_fail("accumulator == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x193,"void FIX::double_conversion::Bignum::Square()");
  }
  this->used_digits_ = iVar1 * 2;
  this->exponent_ = this->exponent_ << 1;
  Clamp(this);
  return;
}

Assistant:

void Bignum::Square() {
  ASSERT(IsClamped());
  int product_length = 2 * used_digits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_digits_) {
    UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  int copy_offset = used_digits_;
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[copy_offset + i] = bigits_[i];
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_digits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_digits_; i < product_length; ++i) {
    int bigit_index1 = used_digits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_digits_) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten bigits_[i] will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_digits_.
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_digits_ = product_length;
  exponent_ *= 2;
  Clamp();
}